

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O0

void __thiscall
cmCTestMemCheckHandler::PostProcessTest
          (cmCTestMemCheckHandler *this,cmCTestTestResult *res,int test)

{
  cmCTest *this_00;
  bool bVar1;
  ostream *poVar2;
  char *msg;
  reference ofile;
  string *f;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  ostringstream local_198 [8];
  ostringstream cmCTestLog_msg;
  int test_local;
  cmCTestTestResult *res_local;
  cmCTestMemCheckHandler *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar2 = std::operator<<((ostream *)local_198,"PostProcessTest memcheck results for : ");
  poVar2 = std::operator<<(poVar2,(string *)res);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  this_00 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::ostringstream::str();
  msg = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(this_00,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
               ,0x4f8,msg,
               (bool)((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet & 1));
  std::__cxx11::string::~string
            ((string *)
             &files.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  if (this->MemoryTesterStyle == 4) {
    PostProcessBoundsCheckerTest(this,res,test);
  }
  else if (this->MemoryTesterStyle == 3) {
    PostProcessDrMemoryTest(this,res,test);
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range3);
    TestOutputFileNames(this,test,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&__range3);
    __end3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range3);
    f = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range3);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&f), bVar1) {
      ofile = __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&__end3);
      AppendMemTesterOutput(this,res,ofile);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end3);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range3);
  }
  return;
}

Assistant:

void cmCTestMemCheckHandler::PostProcessTest(cmCTestTestResult& res, int test)
{
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "PostProcessTest memcheck results for : " << res.Name
                                                               << std::endl,
                     this->Quiet);
  if (this->MemoryTesterStyle == cmCTestMemCheckHandler::BOUNDS_CHECKER) {
    this->PostProcessBoundsCheckerTest(res, test);
  } else if (this->MemoryTesterStyle == cmCTestMemCheckHandler::DRMEMORY) {
    this->PostProcessDrMemoryTest(res, test);
  } else {
    std::vector<std::string> files;
    this->TestOutputFileNames(test, files);
    for (std::string const& f : files) {
      this->AppendMemTesterOutput(res, f);
    }
  }
}